

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureSizeCase::~TextureSizeCase(TextureSizeCase *this)

{
  ~TextureSizeCase(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

TextureSizeCase::~TextureSizeCase (void)
{
	deinit();
}